

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MQTT.hpp
# Opt level: O3

uint32 __thiscall
Protocol::MQTT::V5::FixedField<(Protocol::MQTT::Common::ControlPacketType)3>::copyInto
          (FixedField<(Protocol::MQTT::Common::ControlPacketType)3> *this,uint8 *buffer)

{
  ushort uVar1;
  ulong uVar2;
  ushort uVar3;
  
  uVar1 = (this->super_TopicAndID).topicName.length;
  if (BigEndian(unsigned_short)::signature != '\x01') {
    if (BigEndian(unsigned_short)::signature == '\x04') {
      uVar1 = uVar1 << 8 | uVar1 >> 8;
    }
    else {
      uVar1 = 0;
    }
  }
  *(ushort *)buffer = uVar1;
  memcpy(buffer + 2,(this->super_TopicAndID).topicName.data,
         (ulong)(this->super_TopicAndID).topicName.length);
  uVar1 = (this->super_TopicAndID).topicName.length;
  uVar2 = (ulong)uVar1 + 2;
  if ((this->flags != (byte *)0x0) && ((*this->flags & 6) != 0)) {
    uVar3 = (this->super_TopicAndID).packetID;
    if (BigEndian(unsigned_short)::signature != '\x01') {
      if (BigEndian(unsigned_short)::signature == '\x04') {
        uVar3 = uVar3 << 8 | uVar3 >> 8;
      }
      else {
        uVar3 = 0;
      }
    }
    *(ushort *)(buffer + uVar2) = uVar3;
    uVar2 = (ulong)(uVar1 + 4);
  }
  return (uint32)uVar2;
}

Assistant:

uint32 copyInto(uint8 * buffer) const
                {
                    uint32 o = topicName.copyInto(buffer);
                    if (hasPacketID())
                    {
                        uint16 p = BigEndian(packetID);
                        memcpy(buffer + o, &p, sizeof(p)); o += sizeof(p);
                    }
                    return o;
                }